

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_strtok.c
# Opt level: O1

int main(void)

{
  char *pcVar1;
  constraint_handler_t p_Var2;
  char s [10];
  rsize_t max;
  char *p;
  char *ptr1;
  rsize_t max1;
  char str2 [4];
  char str1 [12];
  rsize_t max2;
  char *ptr2;
  undefined8 local_70;
  undefined2 local_68;
  rsize_t local_60;
  char *local_58;
  char *local_50;
  size_t local_48;
  char local_3c [20];
  size_t local_28;
  char *local_20;
  
  local_70 = 0x645f5f63625f615f;
  local_68 = 0x5f;
  local_60 = strlen((char *)&local_70);
  pcVar1 = _PDCLIB_strtok((char *)&local_70,&local_60,"_",&local_58);
  if (pcVar1 != (char *)((long)&local_70 + 1)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x84,"_PDCLIB_strtok( s, &max, \"_\", &p ) == &s[1]");
  }
  if (local_60 != 6) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x85,"max == 6");
  }
  if (local_70._1_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x86,"s[1] == \'a\'");
  }
  if (local_70._2_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x87,"s[2] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&local_60,"_",&local_58);
  if (pcVar1 != (char *)((long)&local_70 + 3)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x88,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == &s[3]");
  }
  if (local_60 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x89,"max == 3");
  }
  if (local_70._3_1_ != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8a,"s[3] == \'b\'");
  }
  if (local_70._4_1_ != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8b,"s[4] == \'c\'");
  }
  if (local_70._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8c,"s[5] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&local_60,"_",&local_58);
  if (pcVar1 != (char *)((long)&local_70 + 7)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8d,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == &s[7]");
  }
  if (local_60 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8e,"max == 0");
  }
  if (local_70._6_1_ != '_') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8f,"s[6] == \'_\'");
  }
  if (local_70._7_1_ != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x90,"s[7] == \'d\'");
  }
  if ((char)local_68 != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x91,"s[8] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&local_60,"_",&local_58);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x92,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == NULL");
  }
  if (local_60 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x93,"max == 0");
  }
  local_70 = CONCAT26(local_70._6_2_,0x6400000000);
  local_70 = CONCAT44(local_70._4_4_,0x635f6261);
  local_60 = strlen((char *)&local_70);
  pcVar1 = _PDCLIB_strtok((char *)&local_70,&local_60,"_",&local_58);
  if (pcVar1 != (char *)&local_70) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x96,"_PDCLIB_strtok( s, &max, \"_\", &p ) == &s[0]");
  }
  if ((char)local_70 != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x97,"s[0] == \'a\'");
  }
  if (local_70._1_1_ != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x98,"s[1] == \'b\'");
  }
  if (local_70._2_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x99,"s[2] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&local_60,"_",&local_58);
  if (pcVar1 != (char *)((long)&local_70 + 3)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9a,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == &s[3]");
  }
  if (local_70._3_1_ != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9b,"s[3] == \'c\'");
  }
  if (local_70._4_1_ != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9c,"s[4] == \'d\'");
  }
  if (local_70._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9d,"s[5] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&local_60,"_",&local_58);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9e,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == NULL");
  }
  local_70 = CONCAT26(local_70._6_2_,0x6400000000);
  local_70 = CONCAT44(local_70._4_4_,0x632e6261);
  local_60 = 2;
  p_Var2 = set_constraint_handler_s(test_handler);
  if (p_Var2 != abort_handler_s) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xa3,"set_constraint_handler_s( test_handler ) == abort_handler_s");
  }
  pcVar1 = _PDCLIB_strtok((char *)&local_70,&local_60,".",&local_58);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xa4,"_PDCLIB_strtok( s, &max, \".\", &p ) == NULL");
  }
  if (HANDLER_CALLS != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xa5,"HANDLER_CALLS == 1");
  }
  builtin_strncpy(local_3c + 4,"?a???b,,,#c",0xc);
  builtin_strncpy(local_3c,"\t \t",4);
  local_48 = strlen(local_3c + 4);
  local_28 = strlen(local_3c);
  pcVar1 = _PDCLIB_strtok(local_3c + 4,&local_48,"?",&local_50);
  if (pcVar1 != local_3c + 5) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb0,"_PDCLIB_strtok( str1, &max1, \"?\", &ptr1 ) == &str1[1]");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&local_48,",",&local_50);
  if (pcVar1 != local_3c + 7) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb1,"_PDCLIB_strtok( NULL, &max1, \",\", &ptr1 ) == &str1[3]");
  }
  pcVar1 = _PDCLIB_strtok(local_3c,&local_28," \t",&local_20);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb2,"_PDCLIB_strtok( str2, &max2, \" \\t\", &ptr2 ) == NULL");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&local_48,"#,",&local_50);
  if (pcVar1 != local_3c + 0xe) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb3,"_PDCLIB_strtok( NULL, &max1, \"#,\", &ptr1 ) == &str1[10]");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&local_48,"?",&local_50);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb4,"_PDCLIB_strtok( NULL, &max1, \"?\", &ptr1 ) == NULL");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* The original PDCLib strtok() test */
    char s[] = "_a_bc__d_";
    rsize_t max = strlen( s );
    char * p;

    TESTCASE( _PDCLIB_strtok( s, &max, "_", &p ) == &s[1] );
    TESTCASE( max == 6 );
    TESTCASE( s[1] == 'a' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == &s[3] );
    TESTCASE( max == 3 );
    TESTCASE( s[3] == 'b' );
    TESTCASE( s[4] == 'c' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == &s[7] );
    TESTCASE( max == 0 );
    TESTCASE( s[6] == '_' );
    TESTCASE( s[7] == 'd' );
    TESTCASE( s[8] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == NULL );
    TESTCASE( max == 0 );
    strcpy( s, "ab_cd" );
    max = strlen( s );
    TESTCASE( _PDCLIB_strtok( s, &max, "_", &p ) == &s[0] );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[1] == 'b' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == &s[3] );
    TESTCASE( s[3] == 'c' );
    TESTCASE( s[4] == 'd' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == NULL );

    /* Testing the constraint handling */
    strcpy( s, "ab.cd" );
    max = 2;
    TESTCASE( set_constraint_handler_s( test_handler ) == abort_handler_s );
    TESTCASE( _PDCLIB_strtok( s, &max, ".", &p ) == NULL );
    TESTCASE( HANDLER_CALLS == 1 );

    {
        /* The strtok_s() example code from the standard */
        char str1[] = "?a???b,,,#c";
        char str2[] = "\t \t";
        rsize_t max1 = strlen( str1 );
        rsize_t max2 = strlen( str2 );
        char * ptr1;
        char * ptr2;

        TESTCASE( _PDCLIB_strtok( str1, &max1, "?", &ptr1 ) == &str1[1] );
        TESTCASE( _PDCLIB_strtok( NULL, &max1, ",", &ptr1 ) == &str1[3] );
        TESTCASE( _PDCLIB_strtok( str2, &max2, " \t", &ptr2 ) == NULL );
        TESTCASE( _PDCLIB_strtok( NULL, &max1, "#,", &ptr1 ) == &str1[10] );
        TESTCASE( _PDCLIB_strtok( NULL, &max1, "?", &ptr1 ) == NULL );
    }
#endif
    return TEST_RESULTS;
}